

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerGLSL::find_static_extensions(CompilerGLSL *this)

{
  ParsedIR *this_00;
  bool bVar1;
  ExecutionModel EVar2;
  AddressingModel AVar3;
  int iVar4;
  TypedID<(spirv_cross::Types)0> *pTVar5;
  size_t sVar6;
  Capability *pCVar7;
  uint uVar8;
  SPIRType *pSVar9;
  CompilerError *pCVar10;
  byte bVar11;
  long lVar12;
  allocator local_61;
  LoopLock local_60;
  string local_58;
  SPIREntryPoint *local_38;
  
  this_00 = &(this->super_Compiler).ir;
  ParsedIR::create_loop_hard_lock(this_00);
  pTVar5 = (this->super_Compiler).ir.ids_for_type[1].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar6 = (this->super_Compiler).ir.ids_for_type[1].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  for (lVar12 = 0; sVar6 << 2 != lVar12; lVar12 = lVar12 + 4) {
    uVar8 = *(uint *)((long)&pTVar5->id + lVar12);
    if ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[uVar8].type ==
        TypeType) {
      pSVar9 = ParsedIR::get<spirv_cross::SPIRType>(this_00,uVar8);
      switch(*(undefined4 *)&(pSVar9->super_IVariant).field_0xc) {
      case 3:
      case 4:
        ::std::__cxx11::string::string
                  ((string *)&local_58,"GL_EXT_shader_explicit_arithmetic_types_int8",&local_61);
        require_extension_internal(this,&local_58);
        ::std::__cxx11::string::~string((string *)&local_58);
        if ((this->options).vulkan_semantics == true) {
          ::std::__cxx11::string::string((string *)&local_58,"GL_EXT_shader_8bit_storage",&local_61)
          ;
          require_extension_internal(this,&local_58);
          goto LAB_0020240c;
        }
        break;
      case 5:
      case 6:
        ::std::__cxx11::string::string
                  ((string *)&local_58,"GL_EXT_shader_explicit_arithmetic_types_int16",&local_61);
        require_extension_internal(this,&local_58);
        ::std::__cxx11::string::~string((string *)&local_58);
        if ((this->options).vulkan_semantics == true) {
          ::std::__cxx11::string::string
                    ((string *)&local_58,"GL_EXT_shader_16bit_storage",&local_61);
          require_extension_internal(this,&local_58);
          goto LAB_0020240c;
        }
        break;
      case 9:
      case 10:
        if ((this->options).es == true) {
          pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_58,"64-bit integers not supported in ES profile.",&local_61);
          CompilerError::CompilerError(pCVar10,&local_58);
          __cxa_throw(pCVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        ::std::__cxx11::string::string((string *)&local_58,"GL_ARB_gpu_shader_int64",&local_61);
        require_extension_internal(this,&local_58);
LAB_0020240c:
        ::std::__cxx11::string::~string((string *)&local_58);
        break;
      case 0xc:
        ::std::__cxx11::string::string
                  ((string *)&local_58,"GL_EXT_shader_explicit_arithmetic_types_float16",&local_61);
        require_extension_internal(this,&local_58);
        ::std::__cxx11::string::~string((string *)&local_58);
        if ((this->options).vulkan_semantics == true) {
          ::std::__cxx11::string::string
                    ((string *)&local_58,"GL_EXT_shader_16bit_storage",&local_61);
          require_extension_internal(this,&local_58);
          goto LAB_0020240c;
        }
        break;
      case 0xe:
        if ((this->options).es == true) {
          pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_58,"FP64 not supported in ES profile.",&local_61);
          CompilerError::CompilerError(pCVar10,&local_58);
          __cxa_throw(pCVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((this->options).version < 400) {
          ::std::__cxx11::string::string((string *)&local_58,"GL_ARB_gpu_shader_fp64",&local_61);
          require_extension_internal(this,&local_58);
          goto LAB_0020240c;
        }
      }
    }
  }
  ParsedIR::LoopLock::~LoopLock(&local_60);
  local_38 = Compiler::get_entry_point(&this->super_Compiler);
  EVar2 = local_38->model;
  if (EVar2 - ExecutionModelRayGenerationKHR < 6) {
    if (((this->options).es != false) || ((this->options).version < 0x1cc)) {
      pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_58,
                 "Ray tracing shaders require non-es profile with version 460 or above.",
                 (allocator *)&local_60);
      CompilerError::CompilerError(pCVar10,&local_58);
      __cxa_throw(pCVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::string((string *)&local_58,"GL_NV_ray_tracing",(allocator *)&local_60);
    require_extension_internal(this,&local_58);
  }
  else if (EVar2 - ExecutionModelTessellationControl < 2) {
    bVar11 = (this->options).es;
    uVar8 = (this->options).version;
    if ((uVar8 < 0x140 & bVar11) == 1) {
      ::std::__cxx11::string::string
                ((string *)&local_58,"GL_EXT_tessellation_shader",(allocator *)&local_60);
      require_extension_internal(this,&local_58);
      ::std::__cxx11::string::~string((string *)&local_58);
      bVar11 = (this->options).es;
      uVar8 = (this->options).version;
    }
    if (((bVar11 & 1) != 0) || (399 < uVar8)) goto LAB_00202493;
    ::std::__cxx11::string::string
              ((string *)&local_58,"GL_ARB_tessellation_shader",(allocator *)&local_60);
    require_extension_internal(this,&local_58);
  }
  else {
    if (EVar2 != ExecutionModelGeometry) {
      if (EVar2 == ExecutionModelGLCompute) {
        bVar11 = (this->options).es;
        uVar8 = (this->options).version;
        if (uVar8 < 0x1ae && (bool)bVar11 == false) {
          ::std::__cxx11::string::string
                    ((string *)&local_58,"GL_ARB_compute_shader",(allocator *)&local_60);
          require_extension_internal(this,&local_58);
          ::std::__cxx11::string::~string((string *)&local_58);
          bVar11 = (this->options).es;
          uVar8 = (this->options).version;
        }
        if (((bVar11 & 1) != 0) && (uVar8 < 0x136)) {
          pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_58,"At least ESSL 3.10 required for compute shaders.",
                     (allocator *)&local_60);
          CompilerError::CompilerError(pCVar10,&local_58);
          __cxa_throw(pCVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      goto LAB_00202493;
    }
    bVar11 = (this->options).es;
    uVar8 = (this->options).version;
    if ((uVar8 < 0x140 & bVar11) == 1) {
      ::std::__cxx11::string::string
                ((string *)&local_58,"GL_EXT_geometry_shader",(allocator *)&local_60);
      require_extension_internal(this,&local_58);
      ::std::__cxx11::string::~string((string *)&local_58);
      bVar11 = (this->options).es;
      uVar8 = (this->options).version;
    }
    if (((bVar11 & 1) == 0) && (uVar8 < 0x96)) {
      ::std::__cxx11::string::string
                ((string *)&local_58,"GL_ARB_geometry_shader4",(allocator *)&local_60);
      require_extension_internal(this,&local_58);
      ::std::__cxx11::string::~string((string *)&local_58);
    }
    if ((((((local_38->flags).lower & 1) == 0) || (local_38->invocations == 1)) ||
        ((this->options).es != false)) || (399 < (this->options).version)) goto LAB_00202493;
    ::std::__cxx11::string::string((string *)&local_58,"GL_ARB_gpu_shader5",(allocator *)&local_60);
    require_extension_internal(this,&local_58);
  }
  ::std::__cxx11::string::~string((string *)&local_58);
LAB_00202493:
  if (((this->pls_inputs).
       super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (this->pls_inputs).
       super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
       super__Vector_impl_data._M_finish) ||
     ((this->pls_outputs).
      super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->pls_outputs).
      super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    if (local_38->model != ExecutionModelFragment) {
      pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_58,
                 "Can only use GL_EXT_shader_pixel_local_storage in fragment shaders.",
                 (allocator *)&local_60);
      CompilerError::CompilerError(pCVar10,&local_58);
      __cxa_throw(pCVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::string
              ((string *)&local_58,"GL_EXT_shader_pixel_local_storage",(allocator *)&local_60);
    require_extension_internal(this,&local_58);
    ::std::__cxx11::string::~string((string *)&local_58);
  }
  if ((this->inout_color_attachments)._M_h._M_element_count != 0) {
    if (local_38->model != ExecutionModelFragment) {
      pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_58,
                 "Can only use GL_EXT_shader_framebuffer_fetch in fragment shaders.",
                 (allocator *)&local_60);
      CompilerError::CompilerError(pCVar10,&local_58);
      __cxa_throw(pCVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((this->options).vulkan_semantics == true) {
      pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_58,"Cannot use EXT_shader_framebuffer_fetch in Vulkan GLSL.",
                 (allocator *)&local_60);
      CompilerError::CompilerError(pCVar10,&local_58);
      __cxa_throw(pCVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::string
              ((string *)&local_58,"GL_EXT_shader_framebuffer_fetch",(allocator *)&local_60);
    require_extension_internal(this,&local_58);
    ::std::__cxx11::string::~string((string *)&local_58);
  }
  if ((((this->options).separate_shader_objects == true) && ((this->options).es == false)) &&
     ((this->options).version < 0x19a)) {
    ::std::__cxx11::string::string
              ((string *)&local_58,"GL_ARB_separate_shader_objects",(allocator *)&local_60);
    require_extension_internal(this,&local_58);
    ::std::__cxx11::string::~string((string *)&local_58);
  }
  AVar3 = (this->super_Compiler).ir.addressing_model;
  if (AVar3 != AddressingModelLogical) {
    if (AVar3 != AddressingModelPhysicalStorageBuffer64) {
      pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_58,
                 "Only Logical and PhysicalStorageBuffer64EXT addressing models are supported.",
                 (allocator *)&local_60);
      CompilerError::CompilerError(pCVar10,&local_58);
      __cxa_throw(pCVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((this->options).vulkan_semantics == false) {
      pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_58,"GL_EXT_buffer_reference is only supported in Vulkan GLSL.",
                 (allocator *)&local_60);
      CompilerError::CompilerError(pCVar10,&local_58);
      __cxa_throw(pCVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    bVar1 = (this->options).es;
    uVar8 = (this->options).version;
    if ((uVar8 < 0x140 & bVar1) == 1) {
      pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_58,"GL_EXT_buffer_reference requires ESSL 320.",
                 (allocator *)&local_60);
      CompilerError::CompilerError(pCVar10,&local_58);
      __cxa_throw(pCVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (bVar1 == false && uVar8 < 0x1c2) {
      pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_58,"GL_EXT_buffer_reference requires GLSL 450.",
                 (allocator *)&local_60);
      CompilerError::CompilerError(pCVar10,&local_58);
      __cxa_throw(pCVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::string
              ((string *)&local_58,"GL_EXT_buffer_reference",(allocator *)&local_60);
    require_extension_internal(this,&local_58);
    ::std::__cxx11::string::~string((string *)&local_58);
  }
  pCVar7 = (this->super_Compiler).ir.declared_capabilities.super_VectorView<spv::Capability>.ptr;
  sVar6 = (this->super_Compiler).ir.declared_capabilities.super_VectorView<spv::Capability>.
          buffer_size;
  lVar12 = 0;
  do {
    if (sVar6 << 2 == lVar12) {
      return;
    }
    iVar4 = *(int *)((long)pCVar7 + lVar12);
    if (iVar4 == 0x1483) {
      if (local_38->model == ExecutionModelGeometry) {
        ::std::__cxx11::string::string
                  ((string *)&local_58,"GL_NV_geometry_shader_passthrough",(allocator *)&local_60);
        require_extension_internal(this,&local_58);
        ::std::__cxx11::string::~string((string *)&local_58);
        local_38->geometry_passthrough = true;
      }
    }
    else {
      if (iVar4 == 0x14b6) {
        if ((this->options).vulkan_semantics == false) {
          pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_58,
                     "GL_EXT_nonuniform_qualifier is only supported in Vulkan GLSL.",
                     (allocator *)&local_60);
          CompilerError::CompilerError(pCVar10,&local_58);
          __cxa_throw(pCVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        ::std::__cxx11::string::string
                  ((string *)&local_58,"GL_EXT_nonuniform_qualifier",(allocator *)&local_60);
        require_extension_internal(this,&local_58);
      }
      else {
        if (iVar4 != 0x14b5) goto LAB_00202718;
        if ((this->options).vulkan_semantics == false) {
          ::std::__cxx11::string::string
                    ((string *)&local_58,"GL_NV_gpu_shader5",(allocator *)&local_60);
          require_extension_internal(this,&local_58);
        }
        else {
          ::std::__cxx11::string::string
                    ((string *)&local_58,"GL_EXT_nonuniform_qualifier",(allocator *)&local_60);
          require_extension_internal(this,&local_58);
        }
      }
      ::std::__cxx11::string::~string((string *)&local_58);
    }
LAB_00202718:
    lVar12 = lVar12 + 4;
  } while( true );
}

Assistant:

void CompilerGLSL::find_static_extensions()
{
	ir.for_each_typed_id<SPIRType>([&](uint32_t, const SPIRType &type) {
		if (type.basetype == SPIRType::Double)
		{
			if (options.es)
				SPIRV_CROSS_THROW("FP64 not supported in ES profile.");
			if (!options.es && options.version < 400)
				require_extension_internal("GL_ARB_gpu_shader_fp64");
		}
		else if (type.basetype == SPIRType::Int64 || type.basetype == SPIRType::UInt64)
		{
			if (options.es)
				SPIRV_CROSS_THROW("64-bit integers not supported in ES profile.");
			if (!options.es)
				require_extension_internal("GL_ARB_gpu_shader_int64");
		}
		else if (type.basetype == SPIRType::Half)
		{
			require_extension_internal("GL_EXT_shader_explicit_arithmetic_types_float16");
			if (options.vulkan_semantics)
				require_extension_internal("GL_EXT_shader_16bit_storage");
		}
		else if (type.basetype == SPIRType::SByte || type.basetype == SPIRType::UByte)
		{
			require_extension_internal("GL_EXT_shader_explicit_arithmetic_types_int8");
			if (options.vulkan_semantics)
				require_extension_internal("GL_EXT_shader_8bit_storage");
		}
		else if (type.basetype == SPIRType::Short || type.basetype == SPIRType::UShort)
		{
			require_extension_internal("GL_EXT_shader_explicit_arithmetic_types_int16");
			if (options.vulkan_semantics)
				require_extension_internal("GL_EXT_shader_16bit_storage");
		}
	});

	auto &execution = get_entry_point();
	switch (execution.model)
	{
	case ExecutionModelGLCompute:
		if (!options.es && options.version < 430)
			require_extension_internal("GL_ARB_compute_shader");
		if (options.es && options.version < 310)
			SPIRV_CROSS_THROW("At least ESSL 3.10 required for compute shaders.");
		break;

	case ExecutionModelGeometry:
		if (options.es && options.version < 320)
			require_extension_internal("GL_EXT_geometry_shader");
		if (!options.es && options.version < 150)
			require_extension_internal("GL_ARB_geometry_shader4");

		if (execution.flags.get(ExecutionModeInvocations) && execution.invocations != 1)
		{
			// Instanced GS is part of 400 core or this extension.
			if (!options.es && options.version < 400)
				require_extension_internal("GL_ARB_gpu_shader5");
		}
		break;

	case ExecutionModelTessellationEvaluation:
	case ExecutionModelTessellationControl:
		if (options.es && options.version < 320)
			require_extension_internal("GL_EXT_tessellation_shader");
		if (!options.es && options.version < 400)
			require_extension_internal("GL_ARB_tessellation_shader");
		break;

	case ExecutionModelRayGenerationNV:
	case ExecutionModelIntersectionNV:
	case ExecutionModelAnyHitNV:
	case ExecutionModelClosestHitNV:
	case ExecutionModelMissNV:
	case ExecutionModelCallableNV:
		if (options.es || options.version < 460)
			SPIRV_CROSS_THROW("Ray tracing shaders require non-es profile with version 460 or above.");
		require_extension_internal("GL_NV_ray_tracing");
		break;

	default:
		break;
	}

	if (!pls_inputs.empty() || !pls_outputs.empty())
	{
		if (execution.model != ExecutionModelFragment)
			SPIRV_CROSS_THROW("Can only use GL_EXT_shader_pixel_local_storage in fragment shaders.");
		require_extension_internal("GL_EXT_shader_pixel_local_storage");
	}

	if (!inout_color_attachments.empty())
	{
		if (execution.model != ExecutionModelFragment)
			SPIRV_CROSS_THROW("Can only use GL_EXT_shader_framebuffer_fetch in fragment shaders.");
		if (options.vulkan_semantics)
			SPIRV_CROSS_THROW("Cannot use EXT_shader_framebuffer_fetch in Vulkan GLSL.");
		require_extension_internal("GL_EXT_shader_framebuffer_fetch");
	}

	if (options.separate_shader_objects && !options.es && options.version < 410)
		require_extension_internal("GL_ARB_separate_shader_objects");

	if (ir.addressing_model == AddressingModelPhysicalStorageBuffer64EXT)
	{
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("GL_EXT_buffer_reference is only supported in Vulkan GLSL.");
		if (options.es && options.version < 320)
			SPIRV_CROSS_THROW("GL_EXT_buffer_reference requires ESSL 320.");
		else if (!options.es && options.version < 450)
			SPIRV_CROSS_THROW("GL_EXT_buffer_reference requires GLSL 450.");
		require_extension_internal("GL_EXT_buffer_reference");
	}
	else if (ir.addressing_model != AddressingModelLogical)
	{
		SPIRV_CROSS_THROW("Only Logical and PhysicalStorageBuffer64EXT addressing models are supported.");
	}

	// Check for nonuniform qualifier and passthrough.
	// Instead of looping over all decorations to find this, just look at capabilities.
	for (auto &cap : ir.declared_capabilities)
	{
		switch (cap)
		{
		case CapabilityShaderNonUniformEXT:
			if (!options.vulkan_semantics)
				require_extension_internal("GL_NV_gpu_shader5");
			else
				require_extension_internal("GL_EXT_nonuniform_qualifier");
			break;
		case CapabilityRuntimeDescriptorArrayEXT:
			if (!options.vulkan_semantics)
				SPIRV_CROSS_THROW("GL_EXT_nonuniform_qualifier is only supported in Vulkan GLSL.");
			require_extension_internal("GL_EXT_nonuniform_qualifier");
			break;

		case CapabilityGeometryShaderPassthroughNV:
			if (execution.model == ExecutionModelGeometry)
			{
				require_extension_internal("GL_NV_geometry_shader_passthrough");
				execution.geometry_passthrough = true;
			}
			break;

		default:
			break;
		}
	}
}